

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O0

void __thiscall CTxMemPool::AddUnbroadcastTx(CTxMemPool *this,uint256 *txid)

{
  long lVar1;
  bool bVar2;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  GenTxid *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  GenTxid *gtxid;
  CTxMemPool *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  gtxid = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)gtxid,in_RSI,
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  GenTxid::Txid((uint256 *)in_stack_ffffffffffffff68);
  bVar2 = exists(in_stack_ffffffffffffffb0,gtxid);
  if (bVar2) {
    std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::insert
              (in_stack_ffffffffffffff78,
               (value_type *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddUnbroadcastTx(const uint256& txid)
    {
        LOCK(cs);
        // Sanity check the transaction is in the mempool & insert into
        // unbroadcast set.
        if (exists(GenTxid::Txid(txid))) m_unbroadcast_txids.insert(txid);
    }